

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O0

void fsnav_linal_mul_u(double *res,double *v,double *u,size_t m,size_t n)

{
  long lVar1;
  size_t nn1;
  size_t mn;
  size_t nj;
  size_t r0;
  size_t r;
  size_t k0;
  size_t k;
  size_t j;
  size_t i;
  size_t n_local;
  size_t m_local;
  double *u_local;
  double *v_local;
  double *res_local;
  
  nj = m * n - 1;
  while( true ) {
    if (m * n <= nj) {
      return;
    }
    r = (n * (n + 1) >> 1) - 1;
    for (k = 0; k < n; k = k + 1) {
      lVar1 = nj - k;
      res[lVar1] = v[lVar1] * u[r];
      j = 1;
      k0 = (r - k) - 1;
      while (j < n - k) {
        res[lVar1] = v[lVar1 - j] * u[k0] + res[lVar1];
        j = j + 1;
        k0 = k0 - (j + k);
      }
      r = r - (k + 2);
    }
    if (nj < n) break;
    nj = nj - n;
  }
  return;
}

Assistant:

void fsnav_linal_mul_u(double* res, double* v, double* u, const size_t m, const size_t n)
{
	size_t 
		i, j, k, k0, r, r0, 
		nj, mn, nn1;

	mn = m*n;
	nn1 = n*(n+1)/2 - 1;
	for (r0 = mn-1; r0 < mn; r0 -= n) {
		for (j = 0, k0 = nn1; j < n; k0 -= j+2, j++) {
			r = r0 - j;
			nj = n - j;
			res[r] = v[r]*u[k0];
			for (i = 1, k = k0-j-1; i < nj; i++, k -= i+j)
				res[r] += v[r-i]*u[k];
		}
		if (r0 < n)
			break;
	}		
}